

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O3

void garray_arrayviewlist_new(_garray *x)

{
  int iVar1;
  int local_14;
  t_word *local_10;
  
  iVar1 = garray_getfloatwords(x,&local_14,&local_10);
  if (iVar1 != 0) {
    x->field_0x30 = x->field_0x30 | 8;
    pdgui_stub_vnew((t_pd *)x,"pdtk_array_listview_new",x,"si",x->x_realname->s_name,0);
    garray_arrayviewlist_fillpage(x,0.0,0.0);
    return;
  }
  pd_error(x,"error in %s()","garray_arrayviewlist_new");
  return;
}

Assistant:

static void garray_arrayviewlist_new(t_garray *x)
{
    int size=0;
    t_word*data=0;

    if(!garray_getfloatwords(x, &size, &data)) {
        pd_error(x, "error in %s()", __FUNCTION__);
        return;
    }
    x->x_listviewing = 1;

    pdgui_stub_vnew(&x->x_gobj.g_pd,
        "pdtk_array_listview_new", x,
        "si",
        x->x_realname->s_name, 0);

    garray_arrayviewlist_fillpage(x, 0, 0);
}